

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser.cc
# Opt level: O3

bool __thiscall DyndepParser::ParseEdge(DyndepParser *this,string *err)

{
  Lexer *this_00;
  StringPiece path_00;
  StringPiece path_01;
  StringPiece path_02;
  size_type sVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  Node *pNVar5;
  long *plVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  uint uVar8;
  undefined8 uVar9;
  EvalString *this_01;
  _Alloc_hider this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_03;
  undefined1 auVar10 [8];
  pair<std::_Rb_tree_iterator<std::pair<Edge_*const,_Dyndeps>_>,_bool> pVar11;
  string path;
  EvalString out;
  string rule_name;
  vector<EvalString,_std::allocator<EvalString>_> outs;
  vector<EvalString,_std::allocator<EvalString>_> ins;
  EvalString val;
  Node *n_1;
  string local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  _Base_ptr *local_e0;
  undefined1 local_d8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  pointer local_b8;
  pointer local_b0;
  pointer ppNStack_a8;
  pointer local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  vector<EvalString,_std::allocator<EvalString>_> local_78;
  EvalString local_58;
  _Base_ptr *local_40;
  Node *local_38;
  
  local_98._M_dataplus._M_p = (pointer)0x0;
  local_98._M_string_length = 0;
  local_98.field_2._M_allocated_capacity = 0;
  this_00 = &(this->super_Parser).lexer_;
  bVar2 = Lexer::ReadEvalString(this_00,(EvalString *)&local_98,true,err);
  if (bVar2) {
    if (local_98._M_dataplus._M_p == (pointer)local_98._M_string_length) {
      local_d8 = (undefined1  [8])&local_c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"expected path","");
      bVar3 = Lexer::Error(this_00,(string *)local_d8,err);
      if (local_d8 != (undefined1  [8])&local_c8) {
        operator_delete((void *)local_d8,local_c8._M_allocated_capacity + 1);
      }
      goto LAB_0019758d;
    }
    local_98.field_2._8_8_ = &this->env_;
    EvalString::Evaluate_abi_cxx11_
              (&local_138,(EvalString *)&local_98,(Env *)local_98.field_2._8_8_);
    if ((char *)local_138._M_string_length == (char *)0x0) {
      local_d8 = (undefined1  [8])&local_c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"empty path","");
      bVar2 = Lexer::Error(this_00,(string *)local_d8,err);
      uVar8 = (uint)bVar2;
      uVar9 = local_c8._M_allocated_capacity;
      auVar10 = local_d8;
      if (local_d8 != (undefined1  [8])&local_c8) {
LAB_00197770:
        operator_delete((void *)auVar10,uVar9 + 1);
      }
LAB_00197778:
      bVar2 = false;
      local_e0 = (_Base_ptr *)0x0;
    }
    else {
      CanonicalizePath(&local_138,(uint64_t *)&local_78);
      path_00.len_ = local_138._M_string_length;
      path_00.str_ = local_138._M_dataplus._M_p;
      pNVar5 = State::LookupNode((this->super_Parser).state_,path_00);
      if ((pNVar5 == (Node *)0x0) ||
         (local_d8 = (undefined1  [8])pNVar5->in_edge_, local_d8 == (undefined1  [8])0x0)) {
        std::operator+(&local_118,"no build statement exists for \'",&local_138);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_118);
        local_d8 = (undefined1  [8])&local_c8;
        paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 == paVar7) {
          local_c8._M_allocated_capacity = paVar7->_M_allocated_capacity;
          local_c8._8_8_ = plVar6[3];
        }
        else {
          local_c8._M_allocated_capacity = paVar7->_M_allocated_capacity;
          local_d8 = (undefined1  [8])*plVar6;
        }
        paStack_d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)plVar6[1];
        *plVar6 = (long)paVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        bVar2 = Lexer::Error(this_00,(string *)local_d8,err);
LAB_00197744:
        uVar8 = (uint)bVar2;
        if (local_d8 != (undefined1  [8])&local_c8) {
          operator_delete((void *)local_d8,local_c8._M_allocated_capacity + 1);
        }
        auVar10 = (undefined1  [8])
                  CONCAT62(local_118._M_dataplus._M_p._2_6_,local_118._M_dataplus._M_p._0_2_);
        uVar9 = local_118.field_2._M_allocated_capacity;
        if (auVar10 != (undefined1  [8])&local_118.field_2) goto LAB_00197770;
        goto LAB_00197778;
      }
      local_118._M_dataplus._M_p._0_2_ = 0;
      paStack_d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)((ulong)paStack_d0 & 0xffffffffffff0000);
      local_c8._M_allocated_capacity = 0;
      local_c8._8_8_ = (pointer)0x0;
      local_b8 = (pointer)0x0;
      local_118._M_string_length = 0;
      local_118.field_2._M_allocated_capacity = 0;
      local_118.field_2._8_8_ = 0;
      local_b0 = (pointer)0x0;
      ppNStack_a8 = (pointer)0x0;
      local_a0 = (pointer)0x0;
      local_f8 = 0;
      uStack_f0 = 0;
      local_e8 = 0;
      pVar11 = std::
               _Rb_tree<Edge*,std::pair<Edge*const,Dyndeps>,std::_Select1st<std::pair<Edge*const,Dyndeps>>,std::less<Edge*>,std::allocator<std::pair<Edge*const,Dyndeps>>>
               ::_M_insert_unique<std::pair<Edge*const,Dyndeps>>
                         ((_Rb_tree<Edge*,std::pair<Edge*const,Dyndeps>,std::_Select1st<std::pair<Edge*const,Dyndeps>>,std::less<Edge*>,std::allocator<std::pair<Edge*const,Dyndeps>>>
                           *)this->dyndep_file_,(pair<Edge_*const,_Dyndeps> *)local_d8);
      uVar8 = pVar11._8_4_;
      if (local_b0 != (pointer)0x0) {
        operator_delete(local_b0,(long)local_a0 - (long)local_b0);
      }
      if ((pointer)local_c8._M_allocated_capacity != (pointer)0x0) {
        operator_delete((void *)local_c8._M_allocated_capacity,(long)local_b8 - local_c8._0_8_);
      }
      if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        std::operator+(&local_118,"multiple statements for \'",&local_138);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_118);
        local_d8 = (undefined1  [8])&local_c8;
        paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 == paVar7) {
          local_c8._M_allocated_capacity = paVar7->_M_allocated_capacity;
          local_c8._8_8_ = plVar6[3];
        }
        else {
          local_c8._M_allocated_capacity = paVar7->_M_allocated_capacity;
          local_d8 = (undefined1  [8])*plVar6;
        }
        paStack_d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)plVar6[1];
        *plVar6 = (long)paVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        bVar2 = Lexer::Error(this_00,(string *)local_d8,err);
        goto LAB_00197744;
      }
      local_e0 = &pVar11.first._M_node._M_node[1]._M_parent;
      bVar2 = true;
    }
    bVar3 = (byte)uVar8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
               *)&local_98);
    if (!bVar2) goto LAB_0019759a;
    local_118._M_dataplus._M_p._0_2_ = 0;
    local_118._M_dataplus._M_p._2_6_ = 0;
    local_118._M_string_length = 0;
    local_118.field_2._M_allocated_capacity = 0;
    bVar2 = Lexer::ReadEvalString(this_00,(EvalString *)&local_118,true,err);
    if (bVar2) {
      if (CONCAT62(local_118._M_dataplus._M_p._2_6_,local_118._M_dataplus._M_p._0_2_) ==
          local_118._M_string_length) {
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                   *)&local_118);
        local_98._M_dataplus._M_p = (pointer)0x0;
        local_98._M_string_length = 0;
        local_98.field_2._M_allocated_capacity = 0;
        bVar2 = Lexer::PeekToken(this_00,PIPE);
        if (bVar2) {
          while( true ) {
            local_d8 = (undefined1  [8])0x0;
            paStack_d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x0;
            local_c8._M_allocated_capacity = 0;
            bVar2 = Lexer::ReadEvalString(this_00,(EvalString *)local_d8,true,err);
            if (!bVar2) break;
            if (local_d8 == (undefined1  [8])paStack_d0) {
              std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
              ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                         *)local_d8);
              goto LAB_001978e8;
            }
            std::vector<EvalString,_std::allocator<EvalString>_>::push_back
                      ((vector<EvalString,_std::allocator<EvalString>_> *)&local_98,
                       (EvalString *)local_d8);
            std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
            ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                       *)local_d8);
          }
          bVar3 = err != (string *)0x0;
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
          ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                     *)local_d8);
        }
        else {
LAB_001978e8:
          bVar2 = Parser::ExpectToken(&this->super_Parser,COLON,err);
          if (bVar2) {
            local_d8 = (undefined1  [8])&local_c8;
            paStack_d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x0;
            local_c8._M_allocated_capacity = local_c8._M_allocated_capacity & 0xffffffffffffff00;
            bVar2 = Lexer::ReadIdent(this_00,(string *)local_d8);
            if ((bVar2) && (iVar4 = std::__cxx11::string::compare(local_d8), iVar4 == 0)) {
              local_138._M_dataplus._M_p = (pointer)0x0;
              local_138._M_string_length = 0;
              local_138.field_2._M_allocated_capacity = 0;
              bVar2 = Lexer::ReadEvalString(this_00,(EvalString *)&local_138,true,err);
              if (bVar2) {
                if (local_138._M_dataplus._M_p == (pointer)local_138._M_string_length) {
                  std::
                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                             *)&local_138);
                  local_78.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
                  super__Vector_impl_data._M_start = (EvalString *)0x0;
                  local_78.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
                  super__Vector_impl_data._M_finish = (EvalString *)0x0;
                  local_78.super__Vector_base<EvalString,_std::allocator<EvalString>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  bVar2 = Lexer::PeekToken(this_00,PIPE);
                  if (bVar2) {
                    while( true ) {
                      local_118._M_dataplus._M_p._0_2_ = 0;
                      local_118._M_dataplus._M_p._2_6_ = 0;
                      local_118._M_string_length = 0;
                      local_118.field_2._M_allocated_capacity = 0;
                      bVar2 = Lexer::ReadEvalString(this_00,(EvalString *)&local_118,true,err);
                      if (!bVar2) break;
                      if (CONCAT62(local_118._M_dataplus._M_p._2_6_,local_118._M_dataplus._M_p._0_2_
                                  ) == local_118._M_string_length) {
                        std::
                        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                   *)&local_118);
                        goto LAB_00197af2;
                      }
                      std::vector<EvalString,_std::allocator<EvalString>_>::push_back
                                (&local_78,(value_type *)&local_118);
                      std::
                      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                 *)&local_118);
                    }
                    bVar3 = err != (string *)0x0;
                    std::
                    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                               *)&local_118);
                  }
                  else {
LAB_00197af2:
                    bVar2 = Lexer::PeekToken(this_00,PIPE2);
                    if (bVar2) {
                      paVar7 = &local_118.field_2;
                      local_118._M_dataplus._M_p._0_2_ = SUB82(paVar7,0);
                      local_118._M_dataplus._M_p._2_6_ = (undefined6)((ulong)paVar7 >> 0x10);
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_118,"order-only inputs not supported","");
                      bVar3 = Lexer::Error(this_00,&local_118,err);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT62(local_118._M_dataplus._M_p._2_6_,
                                      local_118._M_dataplus._M_p._0_2_) != paVar7) {
                        operator_delete((undefined1 *)
                                        CONCAT62(local_118._M_dataplus._M_p._2_6_,
                                                 local_118._M_dataplus._M_p._0_2_),
                                        local_118.field_2._M_allocated_capacity + 1);
                      }
                    }
                    else {
                      bVar2 = Parser::ExpectToken(&this->super_Parser,NEWLINE,err);
                      if (bVar2) {
                        bVar2 = Lexer::PeekToken(this_00,INDENT);
                        if (bVar2) {
                          paVar7 = &local_118.field_2;
                          local_118._M_dataplus._M_p._0_2_ = SUB82(paVar7,0);
                          local_118._M_dataplus._M_p._2_6_ = (undefined6)((ulong)paVar7 >> 0x10);
                          local_118._M_string_length = 0;
                          local_118.field_2._M_allocated_capacity =
                               local_118.field_2._M_allocated_capacity & 0xffffffffffffff00;
                          local_58.parsed_.
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                          local_58.parsed_.
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                          local_58.parsed_.
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                          bVar2 = ParseLet(this,&local_118,&local_58,err);
                          if (bVar2) {
                            iVar4 = std::__cxx11::string::compare((char *)&local_118);
                            if (iVar4 == 0) {
                              EvalString::Evaluate_abi_cxx11_
                                        (&local_138,&local_58,(Env *)local_98.field_2._8_8_);
                              *(bool *)((long)local_e0 + 1) =
                                   (char *)local_138._M_string_length != (char *)0x0;
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_138._M_dataplus._M_p != &local_138.field_2) {
                                operator_delete(local_138._M_dataplus._M_p,
                                                local_138.field_2._M_allocated_capacity + 1);
                              }
                              bVar2 = true;
                            }
                            else {
                              local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)&local_138,"binding is not \'restat\'","");
                              bVar2 = Lexer::Error(this_00,&local_138,err);
                              uVar8 = (uint)bVar2;
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_138._M_dataplus._M_p != &local_138.field_2) {
                                operator_delete(local_138._M_dataplus._M_p,
                                                local_138.field_2._M_allocated_capacity + 1);
                              }
                              bVar2 = false;
                            }
                          }
                          else {
                            bVar2 = false;
                            uVar8 = 0;
                          }
                          bVar3 = (byte)uVar8;
                          std::
                          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                          ::~vector(&local_58.parsed_);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT62(local_118._M_dataplus._M_p._2_6_,
                                          local_118._M_dataplus._M_p._0_2_) != paVar7) {
                            operator_delete((undefined1 *)
                                            CONCAT62(local_118._M_dataplus._M_p._2_6_,
                                                     local_118._M_dataplus._M_p._0_2_),
                                            local_118.field_2._M_allocated_capacity + 1);
                          }
                          if (!bVar2) goto LAB_00197f34;
                        }
                        local_40 = local_e0 + 1;
                        std::vector<Node_*,_std::allocator<Node_*>_>::reserve
                                  ((vector<Node_*,_std::allocator<Node_*>_> *)local_40,
                                   ((long)local_78.
                                          super__Vector_base<EvalString,_std::allocator<EvalString>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_78.
                                          super__Vector_base<EvalString,_std::allocator<EvalString>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                   -0x5555555555555555);
                        this_01 = local_78.
                                  super__Vector_base<EvalString,_std::allocator<EvalString>_>.
                                  _M_impl.super__Vector_impl_data._M_start;
                        if (local_78.super__Vector_base<EvalString,_std::allocator<EvalString>_>.
                            _M_impl.super__Vector_impl_data._M_start !=
                            local_78.super__Vector_base<EvalString,_std::allocator<EvalString>_>.
                            _M_impl.super__Vector_impl_data._M_finish) {
                          do {
                            EvalString::Evaluate_abi_cxx11_
                                      (&local_118,this_01,(Env *)local_98.field_2._8_8_);
                            sVar1 = local_118._M_string_length;
                            if (local_118._M_string_length == 0) {
                              local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)&local_138,"empty path","");
                              bVar2 = Lexer::Error(this_00,&local_138,err);
                              uVar8 = (uint)bVar2;
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_138._M_dataplus._M_p != &local_138.field_2) {
                                operator_delete(local_138._M_dataplus._M_p,
                                                local_138.field_2._M_allocated_capacity + 1);
                              }
                            }
                            else {
                              CanonicalizePath(&local_118,(uint64_t *)&local_138);
                              path_01.str_._2_6_ = local_118._M_dataplus._M_p._2_6_;
                              path_01.str_._0_2_ = local_118._M_dataplus._M_p._0_2_;
                              path_01.len_ = local_118._M_string_length;
                              local_58.parsed_.
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                              ._M_impl.super__Vector_impl_data._M_start =
                                   (pointer)State::GetNode((this->super_Parser).state_,path_01,
                                                           (uint64_t)local_138._M_dataplus._M_p);
                              std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                                        ((vector<Node_*,_std::allocator<Node_*>_> *)local_40,
                                         (value_type *)&local_58);
                            }
                            bVar3 = (byte)uVar8;
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)CONCAT62(local_118._M_dataplus._M_p._2_6_,
                                            local_118._M_dataplus._M_p._0_2_) != &local_118.field_2)
                            {
                              operator_delete((undefined1 *)
                                              CONCAT62(local_118._M_dataplus._M_p._2_6_,
                                                       local_118._M_dataplus._M_p._0_2_),
                                              local_118.field_2._M_allocated_capacity + 1);
                            }
                            if (sVar1 == 0) goto LAB_00197f34;
                            this_01 = this_01 + 1;
                          } while (this_01 !=
                                   local_78.
                                   super__Vector_base<EvalString,_std::allocator<EvalString>_>.
                                   _M_impl.super__Vector_impl_data._M_finish);
                        }
                        local_e0 = local_e0 + 4;
                        std::vector<Node_*,_std::allocator<Node_*>_>::reserve
                                  ((vector<Node_*,_std::allocator<Node_*>_> *)local_e0,
                                   ((long)(local_98._M_string_length -
                                          (long)local_98._M_dataplus._M_p) >> 3) *
                                   -0x5555555555555555);
                        this_02._M_p = local_98._M_dataplus._M_p;
                        if (local_98._M_dataplus._M_p != (pointer)local_98._M_string_length) {
                          do {
                            EvalString::Evaluate_abi_cxx11_
                                      (&local_118,(EvalString *)this_02._M_p,
                                       (Env *)local_98.field_2._8_8_);
                            sVar1 = local_118._M_string_length;
                            local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
                            if (local_118._M_string_length == 0) {
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)&local_138,"empty path","");
                              bVar2 = Lexer::Error(this_00,&local_138,err);
                              uVar8 = (uint)bVar2;
                            }
                            else {
                              local_138._M_string_length = 0;
                              local_138.field_2._M_allocated_capacity =
                                   local_138.field_2._M_allocated_capacity & 0xffffffffffffff00;
                              CanonicalizePath(&local_118,(uint64_t *)&local_58);
                              path_02.str_._2_6_ = local_118._M_dataplus._M_p._2_6_;
                              path_02.str_._0_2_ = local_118._M_dataplus._M_p._0_2_;
                              path_02.len_ = local_118._M_string_length;
                              local_38 = State::GetNode((this->super_Parser).state_,path_02,
                                                        (uint64_t)
                                                        local_58.parsed_.
                                                                                                                
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                              std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                                        ((vector<Node_*,_std::allocator<Node_*>_> *)local_e0,
                                         &local_38);
                            }
                            bVar3 = (byte)uVar8;
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
                              operator_delete(local_138._M_dataplus._M_p,
                                              local_138.field_2._M_allocated_capacity + 1);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)CONCAT62(local_118._M_dataplus._M_p._2_6_,
                                            local_118._M_dataplus._M_p._0_2_) != &local_118.field_2)
                            {
                              operator_delete((undefined1 *)
                                              CONCAT62(local_118._M_dataplus._M_p._2_6_,
                                                       local_118._M_dataplus._M_p._0_2_),
                                              local_118.field_2._M_allocated_capacity + 1);
                            }
                            if (sVar1 == 0) goto LAB_00197f34;
                            this_02._M_p = this_02._M_p + 0x18;
                          } while (this_02._M_p != (pointer)local_98._M_string_length);
                        }
                        bVar3 = 1;
                      }
                      else {
                        bVar3 = 0;
                      }
                    }
                  }
LAB_00197f34:
                  std::vector<EvalString,_std::allocator<EvalString>_>::~vector(&local_78);
                  goto LAB_00197a1e;
                }
                paVar7 = &local_118.field_2;
                local_118._M_dataplus._M_p._0_2_ = SUB82(paVar7,0);
                local_118._M_dataplus._M_p._2_6_ = (undefined6)((ulong)paVar7 >> 0x10);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_118,"explicit inputs not supported","");
                bVar3 = Lexer::Error(this_00,&local_118,err);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT62(local_118._M_dataplus._M_p._2_6_,local_118._M_dataplus._M_p._0_2_)
                    != paVar7) {
                  operator_delete((undefined1 *)
                                  CONCAT62(local_118._M_dataplus._M_p._2_6_,
                                           local_118._M_dataplus._M_p._0_2_),
                                  local_118.field_2._M_allocated_capacity + 1);
                }
              }
              else {
                bVar3 = false;
              }
              std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
              ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                         *)&local_138);
            }
            else {
              paVar7 = &local_118.field_2;
              local_118._M_dataplus._M_p._0_2_ = SUB82(paVar7,0);
              local_118._M_dataplus._M_p._2_6_ = (undefined6)((ulong)paVar7 >> 0x10);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_118,"expected build command name \'dyndep\'","");
              bVar3 = Lexer::Error(this_00,&local_118,err);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT62(local_118._M_dataplus._M_p._2_6_,local_118._M_dataplus._M_p._0_2_) !=
                  paVar7) {
                operator_delete((undefined1 *)
                                CONCAT62(local_118._M_dataplus._M_p._2_6_,
                                         local_118._M_dataplus._M_p._0_2_),
                                local_118.field_2._M_allocated_capacity + 1);
              }
            }
LAB_00197a1e:
            if (local_d8 != (undefined1  [8])&local_c8) {
              operator_delete((void *)local_d8,local_c8._M_allocated_capacity + 1);
            }
          }
          else {
            bVar3 = 0;
          }
        }
        std::vector<EvalString,_std::allocator<EvalString>_>::~vector
                  ((vector<EvalString,_std::allocator<EvalString>_> *)&local_98);
        goto LAB_0019759a;
      }
      local_d8 = (undefined1  [8])&local_c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_d8,"explicit outputs not supported","");
      bVar3 = Lexer::Error(this_00,(string *)local_d8,err);
      if (local_d8 != (undefined1  [8])&local_c8) {
        operator_delete((void *)local_d8,local_c8._M_allocated_capacity + 1);
      }
    }
    else {
      bVar3 = false;
    }
    this_03 = &local_118;
  }
  else {
    bVar3 = false;
LAB_0019758d:
    this_03 = &local_98;
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
             *)this_03);
LAB_0019759a:
  return (bool)(bVar3 & 1);
}

Assistant:

bool DyndepParser::ParseEdge(string* err) {
  // Parse one explicit output.  We expect it to already have an edge.
  // We will record its dynamically-discovered dependency information.
  Dyndeps* dyndeps = NULL;
  {
    EvalString out0;
    if (!lexer_.ReadPath(&out0, err))
      return false;
    if (out0.empty())
      return lexer_.Error("expected path", err);

    string path = out0.Evaluate(&env_);
    if (path.empty())
      return lexer_.Error("empty path", err);
    uint64_t slash_bits;
    CanonicalizePath(&path, &slash_bits);
    Node* node = state_->LookupNode(path);
    if (!node || !node->in_edge())
      return lexer_.Error("no build statement exists for '" + path + "'", err);
    Edge* edge = node->in_edge();
    std::pair<DyndepFile::iterator, bool> res =
      dyndep_file_->insert(DyndepFile::value_type(edge, Dyndeps()));
    if (!res.second)
      return lexer_.Error("multiple statements for '" + path + "'", err);
    dyndeps = &res.first->second;
  }

  // Disallow explicit outputs.
  {
    EvalString out;
    if (!lexer_.ReadPath(&out, err))
      return false;
    if (!out.empty())
      return lexer_.Error("explicit outputs not supported", err);
  }

  // Parse implicit outputs, if any.
  vector<EvalString> outs;
  if (lexer_.PeekToken(Lexer::PIPE)) {
    for (;;) {
      EvalString out;
      if (!lexer_.ReadPath(&out, err))
        return err;
      if (out.empty())
        break;
      outs.push_back(out);
    }
  }

  if (!ExpectToken(Lexer::COLON, err))
    return false;

  string rule_name;
  if (!lexer_.ReadIdent(&rule_name) || rule_name != "dyndep")
    return lexer_.Error("expected build command name 'dyndep'", err);

  // Disallow explicit inputs.
  {
    EvalString in;
    if (!lexer_.ReadPath(&in, err))
      return false;
    if (!in.empty())
      return lexer_.Error("explicit inputs not supported", err);
  }

  // Parse implicit inputs, if any.
  vector<EvalString> ins;
  if (lexer_.PeekToken(Lexer::PIPE)) {
    for (;;) {
      EvalString in;
      if (!lexer_.ReadPath(&in, err))
        return err;
      if (in.empty())
        break;
      ins.push_back(in);
    }
  }

  // Disallow order-only inputs.
  if (lexer_.PeekToken(Lexer::PIPE2))
    return lexer_.Error("order-only inputs not supported", err);

  if (!ExpectToken(Lexer::NEWLINE, err))
    return false;

  if (lexer_.PeekToken(Lexer::INDENT)) {
    string key;
    EvalString val;
    if (!ParseLet(&key, &val, err))
      return false;
    if (key != "restat")
      return lexer_.Error("binding is not 'restat'", err);
    string value = val.Evaluate(&env_);
    dyndeps->restat_ = !value.empty();
  }

  dyndeps->implicit_inputs_.reserve(ins.size());
  for (vector<EvalString>::iterator i = ins.begin(); i != ins.end(); ++i) {
    string path = i->Evaluate(&env_);
    if (path.empty())
      return lexer_.Error("empty path", err);
    uint64_t slash_bits;
    CanonicalizePath(&path, &slash_bits);
    Node* n = state_->GetNode(path, slash_bits);
    dyndeps->implicit_inputs_.push_back(n);
  }

  dyndeps->implicit_outputs_.reserve(outs.size());
  for (vector<EvalString>::iterator i = outs.begin(); i != outs.end(); ++i) {
    string path = i->Evaluate(&env_);
    if (path.empty())
      return lexer_.Error("empty path", err);
    string path_err;
    uint64_t slash_bits;
    CanonicalizePath(&path, &slash_bits);
    Node* n = state_->GetNode(path, slash_bits);
    dyndeps->implicit_outputs_.push_back(n);
  }

  return true;
}